

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  String *in_RDI;
  char *temp_1;
  char *temp;
  uint total_size;
  uint other_size;
  uint my_old_size;
  String *in_stack_ffffffffffffff98;
  
  uVar2 = size(in_stack_ffffffffffffff98);
  uVar3 = size(in_stack_ffffffffffffff98);
  uVar4 = uVar2 + uVar3;
  bVar1 = isOnStack(in_RDI);
  if (bVar1) {
    if (uVar4 < 0x18) {
      pcVar5 = c_str((String *)0x1065f0);
      memcpy((void *)((long)&in_RDI->field_0 + (ulong)uVar2),pcVar5,(ulong)(uVar3 + 1));
      setLast(in_RDI,0x17 - uVar4);
    }
    else {
      pcVar5 = (char *)operator_new__((ulong)(uVar4 + 1));
      memcpy(pcVar5,in_RDI,(ulong)uVar2);
      setOnHeap(in_RDI);
      (in_RDI->field_0).data.size = uVar4;
      (in_RDI->field_0).data.capacity = (in_RDI->field_0).data.size + 1;
      (in_RDI->field_0).data.ptr = pcVar5;
      pcVar5 = (in_RDI->field_0).data.ptr;
      pcVar6 = c_str((String *)0x10668a);
      memcpy(pcVar5 + uVar2,pcVar6,(ulong)(uVar3 + 1));
    }
  }
  else if (uVar4 < (in_RDI->field_0).data.capacity) {
    (in_RDI->field_0).data.size = uVar4;
    pcVar5 = (in_RDI->field_0).data.ptr;
    pcVar6 = c_str((String *)0x1066da);
    memcpy(pcVar5 + uVar2,pcVar6,(ulong)(uVar3 + 1));
  }
  else {
    (in_RDI->field_0).data.capacity = (in_RDI->field_0).data.capacity << 1;
    if ((in_RDI->field_0).data.capacity <= uVar4) {
      (in_RDI->field_0).data.capacity = uVar4 + 1;
    }
    pcVar6 = (char *)operator_new__((ulong)(in_RDI->field_0).data.capacity);
    memcpy(pcVar6,(in_RDI->field_0).data.ptr,(ulong)uVar2);
    pcVar5 = (in_RDI->field_0).data.ptr;
    if (pcVar5 != (char *)0x0) {
      operator_delete__(pcVar5);
    }
    (in_RDI->field_0).data.size = uVar4;
    (in_RDI->field_0).data.ptr = pcVar6;
    pcVar5 = (in_RDI->field_0).data.ptr;
    pcVar6 = c_str((String *)0x106795);
    memcpy(pcVar5 + uVar2,pcVar6,(ulong)(uVar3 + 1));
  }
  return in_RDI;
}

Assistant:

String& String::operator+=(const String& other) {
    const unsigned my_old_size = size();
    const unsigned other_size  = other.size();
    const unsigned total_size  = my_old_size + other_size;
    if(isOnStack()) {
        if(total_size < len) {
            // append to the current stack space
            memcpy(buf + my_old_size, other.c_str(), other_size + 1);
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            setLast(last - total_size);
        } else {
            // alloc new chunk
            char* temp = new char[total_size + 1];
            // copy current data to new location before writing in the union
            memcpy(temp, buf, my_old_size); // skip the +1 ('\0') for speed
            // update data in union
            setOnHeap();
            data.size     = total_size;
            data.capacity = data.size + 1;
            data.ptr      = temp;
            // transfer the rest of the data
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        }
    } else {
        if(data.capacity > total_size) {
            // append to the current heap block
            data.size = total_size;
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        } else {
            // resize
            data.capacity *= 2;
            if(data.capacity <= total_size)
                data.capacity = total_size + 1;
            // alloc new chunk
            char* temp = new char[data.capacity];
            // copy current data to new location before releasing it
            memcpy(temp, data.ptr, my_old_size); // skip the +1 ('\0') for speed
            // release old chunk
            delete[] data.ptr;
            // update the rest of the union members
            data.size = total_size;
            data.ptr  = temp;
            // transfer the rest of the data
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        }
    }

    return *this;
}